

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfLut.h
# Opt level: O0

void __thiscall
Imf_3_2::RgbaLut::RgbaLut<Imath_3_2::half(*)(Imath_3_2::half)>
          (RgbaLut *this,_func_half_half *f,RgbaChannels chn)

{
  half hVar1;
  half hVar2;
  half hVar3;
  undefined4 in_EDX;
  undefined8 in_RSI;
  _func_half_half *in_RDI;
  float in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined2 in_stack_ffffffffffffffe6;
  
  Imath_3_2::half::half
            ((half *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc);
  Imath_3_2::half::half
            ((half *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc);
  Imath_3_2::half::half
            ((half *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc);
  hVar1 = Imath_3_2::half::posInf();
  hVar2 = Imath_3_2::half::negInf();
  hVar3 = Imath_3_2::half::qNan();
  halfFunction<Imath_3_2::half>::halfFunction<Imath_3_2::half(*)(Imath_3_2::half)>
            ((halfFunction<Imath_3_2::half> *)
             CONCAT26(in_stack_ffffffffffffffe6,CONCAT24(hVar1._h,CONCAT22(hVar2._h,hVar3._h))),
             in_RDI,(half)(uint16_t)((ulong)in_RSI >> 0x30),(half)(uint16_t)((ulong)in_RSI >> 0x20),
             (half)(uint16_t)((ulong)in_RSI >> 0x10),(half)(uint16_t)in_RSI,
             (half)(uint16_t)((uint)in_EDX >> 0x10),(half)(uint16_t)in_EDX);
  *(undefined4 *)(in_RDI + 8) = in_EDX;
  return;
}

Assistant:

RgbaLut::RgbaLut (Function f, RgbaChannels chn)
    : _lut (
          f,
          -HALF_MAX,
          HALF_MAX,
          half (0),
          half::posInf (),
          half::negInf (),
          half::qNan ())
    , _chn (chn)
{
    // empty
}